

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::internal::TracingMuxerImpl::ConsumerImpl::ConsumerImpl
          (ConsumerImpl *this,TracingMuxerImpl *muxer,BackendType backend_type,
          TracingBackendId backend_id,TracingSessionGlobalID session_id)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Consumer)._vptr_Consumer = (_func_int **)&PTR__ConsumerImpl_003c8988;
  this->muxer_ = muxer;
  this->backend_type_ = backend_type;
  this->backend_id_ = backend_id;
  this->session_id_ = session_id;
  (this->trace_config_).
  super___shared_ptr<perfetto::protos::gen::TraceConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->trace_config_).
  super___shared_ptr<perfetto::protos::gen::TraceConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->connected_ = false;
  this->start_pending_ = false;
  this->stop_pending_ = false;
  this->get_trace_stats_pending_ = false;
  this->stopped_ = false;
  (this->trace_fd_).t_ = -1;
  p_Var1 = &(this->data_source_states_)._M_t._M_impl.super__Rb_tree_header;
  (this->data_source_states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->data_source_states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&this->start_complete_callback_,0,0x100);
  (this->data_source_states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->data_source_states_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->data_source_states_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->service_)._M_t.
  super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
  .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl = (ConsumerEndpoint *)0x0
  ;
  return;
}

Assistant:

TracingMuxerImpl::ConsumerImpl::ConsumerImpl(TracingMuxerImpl* muxer,
                                             BackendType backend_type,
                                             TracingBackendId backend_id,
                                             TracingSessionGlobalID session_id)
    : muxer_(muxer),
      backend_type_(backend_type),
      backend_id_(backend_id),
      session_id_(session_id) {}